

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
getfrom_reader::perform(getfrom_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  FileReader *__p;
  undefined8 *puVar1;
  ReadWriter_ptr w;
  ReadWriter_ptr rd;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (1 < g_verbose) {
    printf("dogetbytes(%s, %08llx, %08zx)\n",(this->_readername)._M_dataplus._M_p,this->_ofs,
           this->_n);
  }
  readercollection::getbyname((readercollection *)&rd,(string *)rdlist);
  if (rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    (*(rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter[4])
              (rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->_ofs);
    __p = (FileReader *)operator_new(0x40);
    FileReader::FileReader(__p,&this->_savename);
    std::__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<FileReader,void>
              ((__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2> *)&w,__p);
    std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,&w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>);
    ReadWriter::copyto<std::shared_ptr<ReadWriter>>
              (rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (shared_ptr<ReadWriter> *)&local_28,this->_n);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&w.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rd.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "getfrom: invalid rdname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dogetbytes(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _n);

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "getfrom: invalid rdname";

        rd->setpos(_ofs);

        ReadWriter_ptr w(new FileReader(_savename, FileReader::createnew));

        rd->copyto(w, _n);
    }